

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pRVar7;
  reference pvVar8;
  string local_8c0 [32];
  ostringstream local_8a0 [8];
  ostringstream cmCTestLog_msg_4;
  RegularExpression *rx_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2_3;
  ostringstream local_6e8 [8];
  ostringstream cmCTestLog_msg_3;
  RegularExpression *rx_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2_2;
  string local_548 [4];
  int wrxCnt_1;
  ostringstream local_528 [8];
  ostringstream cmCTestLog_msg_2;
  RegularExpression *rx_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2_1;
  ostringstream local_370 [8];
  ostringstream cmCTestLog_msg_1;
  RegularExpression *rx;
  iterator __end2;
  iterator __begin2;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2;
  int wrxCnt;
  int errorLine;
  int warningLine;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  char *data_local;
  cmCTestBuildHandler *this_local;
  
  if ((this->UseCTestLaunch & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,"Line: [");
    poVar5 = std::operator<<(poVar5,data);
    poVar5 = std::operator<<(poVar5,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x440,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&errorLine);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    bVar3 = false;
    bVar2 = false;
    if ((this->ErrorQuotaReached & 1U) == 0) {
      __range2._4_4_ = 0;
      __end2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
               begin(&this->ErrorMatchRegex);
      rx = (RegularExpression *)
           std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                     (&this->ErrorMatchRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                         *)&rx), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2);
        bVar4 = cmsys::RegularExpression::find(pRVar7,data);
        if (bVar4) {
          bVar2 = true;
          std::__cxx11::ostringstream::ostringstream(local_370);
          poVar5 = std::operator<<((ostream *)local_370,"  Error Line: ");
          poVar5 = std::operator<<(poVar5,data);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomErrorMatches,(long)__range2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x451,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)&__range2_1);
          std::__cxx11::ostringstream::~ostringstream(local_370);
          break;
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2);
      }
      __range2._4_4_ = 0;
      __end2_1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->ErrorExceptionRegex);
      rx_1 = (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       (&this->ErrorExceptionRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 *)&rx_1), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2_1);
        bVar4 = cmsys::RegularExpression::find(pRVar7,data);
        if (bVar4) {
          bVar2 = false;
          std::__cxx11::ostringstream::ostringstream(local_528);
          poVar5 = std::operator<<((ostream *)local_528,"  Not an error Line: ");
          poVar5 = std::operator<<(poVar5,data);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomErrorExceptions,(long)__range2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x460,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_548);
          std::__cxx11::ostringstream::~ostringstream(local_528);
          break;
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2_1);
      }
    }
    if ((this->WarningQuotaReached & 1U) == 0) {
      __range2_2._4_4_ = 0;
      __end2_2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->WarningMatchRegex);
      rx_2 = (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       (&this->WarningMatchRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 *)&rx_2), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2_2);
        bVar4 = cmsys::RegularExpression::find(pRVar7,data);
        if (bVar4) {
          bVar3 = true;
          std::__cxx11::ostringstream::ostringstream(local_6e8);
          poVar5 = std::operator<<((ostream *)local_6e8,"  Warning Line: ");
          poVar5 = std::operator<<(poVar5,data);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomWarningMatches,(long)__range2_2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x471,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)&__range2_3);
          std::__cxx11::ostringstream::~ostringstream(local_6e8);
          break;
        }
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2_2);
      }
      __range2_2._4_4_ = 0;
      __end2_3 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->WarningExceptionRegex);
      rx_3 = (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       (&this->WarningExceptionRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 *)&rx_3), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2_3);
        bVar4 = cmsys::RegularExpression::find(pRVar7,data);
        if (bVar4) {
          bVar3 = false;
          std::__cxx11::ostringstream::ostringstream(local_8a0);
          poVar5 = std::operator<<((ostream *)local_8a0,"  Not a warning Line: ");
          poVar5 = std::operator<<(poVar5,data);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomWarningExceptions,(long)__range2_2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x481,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_8c0);
          std::__cxx11::ostringstream::~ostringstream(local_8a0);
          break;
        }
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2_3);
      }
    }
    if (bVar2) {
      this_local._4_4_ = 2;
    }
    else if (bVar3) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << data << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(data)) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << data << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(data)) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << data << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(data)) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(data)) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}